

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * flatbuffers::GenIncludeGuard
                   (string *__return_storage_ptr__,string *file_name,Namespace *name_space,
                   string *postfix)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer pbVar6;
  size_type sVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  size_type sVar12;
  string *component;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  pcVar4 = (file_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + file_name->_M_string_length);
  pcVar9 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar5 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar9 + uVar5;
  pcVar10 = pcVar9;
  if (0 < (long)uVar5 >> 2) {
    pcVar10 = pcVar9 + (uVar5 & 0xfffffffffffffffc);
    lVar11 = ((long)uVar5 >> 2) + 1;
    pcVar9 = pcVar9 + 3;
    do {
      if (((int)pcVar9[-3] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar9[-3] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + -3;
        goto LAB_00165d9e;
      }
      if (((int)pcVar9[-2] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar9[-2] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + -2;
        goto LAB_00165d9e;
      }
      if (((int)pcVar9[-1] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar9[-1] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + -1;
        goto LAB_00165d9e;
      }
      if (((int)*pcVar9 & 0xffffffdfU) - 0x5b < 0xffffffe6 && (int)*pcVar9 - 0x3aU < 0xfffffff6)
      goto LAB_00165d9e;
      lVar11 = lVar11 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar11);
  }
  lVar11 = (long)pcVar1 - (long)pcVar10;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      pcVar9 = pcVar1;
      if ((lVar11 != 3) ||
         (pcVar9 = pcVar10,
         ((int)*pcVar10 & 0xffffffdfU) - 0x5b < 0xffffffe6 && (int)*pcVar10 - 0x3aU < 0xfffffff6))
      goto LAB_00165d9e;
      pcVar10 = pcVar10 + 1;
    }
    pcVar9 = pcVar10;
    if (((int)*pcVar10 & 0xffffffdfU) - 0x5b < 0xffffffe6 && (int)*pcVar10 - 0x3aU < 0xfffffff6)
    goto LAB_00165d9e;
    pcVar10 = pcVar10 + 1;
  }
  pcVar9 = pcVar10;
  if (0xfffffff5 < (int)*pcVar10 - 0x3aU) {
    pcVar9 = pcVar1;
  }
  if (0xffffffe5 < ((int)*pcVar10 & 0xffffffdfU) - 0x5b) {
    pcVar9 = pcVar1;
  }
LAB_00165d9e:
  pcVar10 = pcVar9 + 1;
  if (pcVar10 != pcVar1 && pcVar9 != pcVar1) {
    do {
      cVar3 = *pcVar10;
      if (0xffffffe5 < ((int)cVar3 & 0xffffffdfU) - 0x5b || 0xfffffff5 < (int)cVar3 - 0x3aU) {
        *pcVar9 = cVar3;
        pcVar9 = pcVar9 + 1;
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar1);
  }
  __return_storage_ptr__->_M_string_length =
       (long)pcVar9 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *pcVar9 = '\0';
  std::operator+(&local_60,"FLATBUFFERS_GENERATED_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_38 = postfix;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar13 = (name_space->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (name_space->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != pbVar6) {
    do {
      pcVar4 = (pbVar13->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar4,pcVar4 + pbVar13->_M_string_length);
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar6);
  }
  if (local_38->_M_string_length != 0) {
    pcVar4 = (local_38->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar4,pcVar4 + local_38->_M_string_length);
    std::__cxx11::string::append((char *)&local_60);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar7 = __return_storage_ptr__->_M_string_length;
  if (sVar7 != 0) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar12 = 0;
    do {
      iVar8 = toupper((uint)(byte)pcVar4[sVar12]);
      pcVar4[sVar12] = (char)iVar8;
      sVar12 = sVar12 + 1;
    } while (sVar7 != sVar12);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenIncludeGuard(const std::string &file_name,
                                   const Namespace &name_space,
                                   const std::string &postfix = "") {
  // Generate include guard.
  std::string guard = file_name;
  // Remove any non-alpha-numeric characters that may appear in a filename.
  struct IsAlnum {
    bool operator()(char c) const { return !is_alnum(c); }
  };
  guard.erase(std::remove_if(guard.begin(), guard.end(), IsAlnum()),
              guard.end());
  guard = "FLATBUFFERS_GENERATED_" + guard;
  guard += "_";
  // For further uniqueness, also add the namespace.
  for (const std::string &component : name_space.components) {
    guard += component + "_";
  }
  // Anything extra to add to the guard?
  if (!postfix.empty()) { guard += postfix + "_"; }
  guard += "H_";
  std::transform(guard.begin(), guard.end(), guard.begin(), CharToUpper);
  return guard;
}